

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_wrapper.h
# Opt level: O2

void __thiscall leveldb::IteratorWrapper::Seek(IteratorWrapper *this,Slice *k)

{
  if (this->iter_ != (Iterator *)0x0) {
    (*this->iter_->_vptr_Iterator[5])();
    Update(this);
    return;
  }
  __assert_fail("iter_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/iterator_wrapper.h"
                ,0x3e,"void leveldb::IteratorWrapper::Seek(const Slice &)");
}

Assistant:

void Seek(const Slice& k) {
    assert(iter_);
    iter_->Seek(k);
    Update();
  }